

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

int equation_system_solve(aom_equation_system_t *eqns)

{
  long lVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_t size;
  long lVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  bool bVar10;
  void *__dest;
  void *__dest_00;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  void *pvVar15;
  ulong uVar16;
  void *pvVar17;
  uint uVar18;
  double *pdVar19;
  void *pvVar20;
  void *pvVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  undefined8 local_58;
  
  uVar7 = eqns->n;
  uVar25 = (ulong)(int)uVar7;
  size = uVar25 * 8;
  __dest = aom_malloc(size);
  __dest_00 = aom_malloc(size * uVar25);
  if ((__dest_00 == (void *)0x0) || (__dest == (void *)0x0)) {
    iVar14 = 0;
    fprintf(_stderr,"Unable to allocate temp values of size %dx%d\n",(ulong)uVar7,(ulong)uVar7);
  }
  else {
    memcpy(__dest_00,eqns->A,size * uVar25);
    memcpy(__dest,eqns->b,size);
    iVar8 = eqns->n;
    uVar11 = (ulong)iVar8;
    pdVar9 = eqns->x;
    uVar18 = uVar7 - 1;
    if (1 < (int)uVar7) {
      lVar1 = uVar25 - 1;
      pvVar17 = (void *)((long)__dest_00 + (uVar25 - 2) * uVar11 * 8);
      lVar5 = uVar11 * 8;
      pvVar2 = (void *)((long)__dest_00 + lVar1 * uVar11 * 8);
      local_58 = (void *)((long)__dest_00 + uVar11 * 8);
      uVar16 = 0;
      pvVar21 = pvVar17;
      pvVar20 = pvVar2;
      lVar22 = lVar1;
      pvVar15 = __dest_00;
      do {
        do {
          lVar23 = lVar22 + -1;
          if (ABS(*(double *)((long)__dest_00 + lVar23 * uVar11 * 8 + uVar16 * 8)) <
              ABS(*(double *)((long)__dest_00 + lVar22 * uVar11 * 8 + uVar16 * 8))) {
            uVar12 = 0;
            do {
              uVar6 = *(undefined8 *)((long)pvVar20 + uVar12 * 8);
              *(undefined8 *)((long)pvVar20 + uVar12 * 8) =
                   *(undefined8 *)((long)pvVar21 + uVar12 * 8);
              *(undefined8 *)((long)pvVar21 + uVar12 * 8) = uVar6;
              uVar12 = uVar12 + 1;
            } while (uVar25 != uVar12);
            puVar3 = (undefined8 *)((long)__dest + lVar23 * 8);
            uVar6 = *puVar3;
            puVar4 = (undefined8 *)((long)__dest + lVar23 * 8);
            *puVar4 = puVar3[1];
            puVar4[1] = uVar6;
          }
          pvVar21 = (void *)((long)pvVar21 + uVar11 * -8);
          pvVar20 = (void *)((long)pvVar20 + uVar11 * -8);
          lVar22 = lVar23;
        } while ((long)uVar16 < lVar23);
        pvVar21 = local_58;
        uVar12 = uVar16;
        do {
          dVar27 = *(double *)((long)__dest_00 + (long)((int)uVar16 * iVar8) * 8 + uVar16 * 8);
          if (ABS(dVar27) < 1e-16) goto LAB_002abc69;
          uVar12 = uVar12 + 1;
          dVar27 = -*(double *)((long)__dest_00 + uVar12 * uVar11 * 8 + uVar16 * 8) / dVar27;
          uVar13 = 0;
          do {
            *(double *)((long)pvVar21 + uVar13 * 8) =
                 *(double *)((long)pvVar15 + uVar13 * 8) * dVar27 +
                 *(double *)((long)pvVar21 + uVar13 * 8);
            uVar13 = uVar13 + 1;
          } while (uVar25 != uVar13);
          *(double *)((long)__dest + uVar12 * 8) =
               dVar27 * *(double *)((long)__dest + uVar16 * 8) +
               *(double *)((long)__dest + uVar12 * 8);
          pvVar21 = (void *)((long)pvVar21 + lVar5);
        } while (uVar12 != uVar18);
        uVar16 = uVar16 + 1;
        local_58 = (void *)((long)local_58 + lVar5);
        pvVar15 = (void *)((long)pvVar15 + lVar5);
        pvVar21 = pvVar17;
        pvVar20 = pvVar2;
        lVar22 = lVar1;
      } while (uVar16 != uVar18);
    }
    iVar14 = 1;
    if (0 < (int)uVar7) {
      pvVar17 = (void *)((long)__dest_00 + (uVar25 - 1) * uVar11 * 8);
      pdVar19 = pdVar9;
      uVar12 = uVar25;
      uVar16 = (ulong)uVar18;
      do {
        uVar16 = uVar16 + 1;
        uVar13 = uVar12 - 1;
        dVar27 = *(double *)((long)__dest_00 + (long)(iVar8 * (int)uVar13) * 8 + uVar12 * 8 + -8);
        if (ABS(dVar27) < 1e-16) goto LAB_002abc69;
        dVar26 = 0.0;
        uVar24 = uVar25;
        if ((long)uVar12 <= (long)(ulong)uVar18) {
          do {
            dVar26 = dVar26 + *(double *)((long)pvVar17 + uVar24 * 8) * pdVar19[uVar24];
            uVar24 = uVar24 + 1;
          } while (uVar16 != uVar24);
        }
        pdVar9[uVar13] = (*(double *)((long)__dest + uVar13 * 8) - dVar26) / dVar27;
        pdVar19 = pdVar19 + -1;
        pvVar17 = (void *)((long)pvVar17 + ~uVar11 * 8);
        bVar10 = 1 < (long)uVar12;
        uVar12 = uVar13;
      } while (bVar10);
    }
  }
LAB_002abc6b:
  aom_free(__dest);
  aom_free(__dest_00);
  return iVar14;
LAB_002abc69:
  iVar14 = 0;
  goto LAB_002abc6b;
}

Assistant:

static int equation_system_solve(aom_equation_system_t *eqns) {
  const int n = eqns->n;
  double *b = (double *)aom_malloc(sizeof(*b) * n);
  double *A = (double *)aom_malloc(sizeof(*A) * n * n);
  int ret = 0;
  if (A == NULL || b == NULL) {
    fprintf(stderr, "Unable to allocate temp values of size %dx%d\n", n, n);
    aom_free(b);
    aom_free(A);
    return 0;
  }
  memcpy(A, eqns->A, sizeof(*eqns->A) * n * n);
  memcpy(b, eqns->b, sizeof(*eqns->b) * n);
  ret = linsolve(n, A, eqns->n, b, eqns->x);
  aom_free(b);
  aom_free(A);

  if (ret == 0) {
    return 0;
  }
  return 1;
}